

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O1

bool testing::internal::ParseNaturalNumber<int>(string *str,int *number)

{
  byte *__nptr;
  bool bVar1;
  int *piVar2;
  ulonglong uVar3;
  bool bVar4;
  char *local_38;
  char *end;
  
  if ((str->_M_string_length == 0) || (__nptr = (byte *)(str->_M_dataplus)._M_p, 9 < *__nptr - 0x30)
     ) {
    bVar4 = false;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0;
    uVar3 = strtoull((char *)__nptr,&local_38,10);
    if (*local_38 == '\0') {
      bVar4 = *piVar2 == 0;
    }
    else {
      bVar4 = false;
    }
    bVar1 = IsTrue(true);
    if (!bVar1) {
      GTestLog::GTestLog((GTestLog *)((long)&end + 4),GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-internal-inl.h"
                         ,0x40c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition sizeof(Integer) <= sizeof(parsed) failed. ",0x34);
      GTestLog::~GTestLog((GTestLog *)((long)&end + 4));
    }
    bVar4 = (bool)(bVar4 & (long)(int)uVar3 == uVar3);
    if (bVar4 == true) {
      *number = (int)uVar3;
    }
  }
  return bVar4;
}

Assistant:

bool ParseNaturalNumber(const ::std::string& str, Integer* number) {
  // Fail fast if the given string does not begin with a digit;
  // this bypasses strtoXXX's "optional leading whitespace and plus
  // or minus sign" semantics, which are undesirable here.
  if (str.empty() || !IsDigit(str[0])) {
    return false;
  }
  errno = 0;

  char* end;
  // BiggestConvertible is the largest integer type that system-provided
  // string-to-number conversion routines can return.
  using BiggestConvertible = unsigned long long;  // NOLINT

  const BiggestConvertible parsed = strtoull(str.c_str(), &end, 10);  // NOLINT
  const bool parse_success = *end == '\0' && errno == 0;

  GTEST_CHECK_(sizeof(Integer) <= sizeof(parsed));

  const Integer result = static_cast<Integer>(parsed);
  if (parse_success && static_cast<BiggestConvertible>(result) == parsed) {
    *number = result;
    return true;
  }
  return false;
}